

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void crnlib::end_nonzero_run(uint *size,uint len,vector<unsigned_short> *codes)

{
  uint uVar1;
  short sVar2;
  ulong uVar3;
  unsigned_short uVar4;
  unsigned_short *obj;
  undefined8 uStack_28;
  
  uVar1 = *size;
  uVar3 = (ulong)uVar1;
  if (uVar1 != 0) {
    uStack_28 = uVar3;
    if (uVar1 < 3) {
      while (*size = (int)uVar3 - 1, (int)uVar3 != 0) {
        uStack_28._0_4_ = CONCAT22((short)len,(undefined2)uStack_28);
        vector<unsigned_short>::push_back(codes,(unsigned_short *)((long)&uStack_28 + 2));
        uVar3 = (ulong)*size;
      }
    }
    else {
      sVar2 = (short)uVar1 * 0x100;
      if (uVar1 < 7) {
        uVar4 = sVar2 - 0x2ed;
        obj = (unsigned_short *)((long)&uStack_28 + 6);
      }
      else {
        uVar4 = sVar2 - 0x6ec;
        obj = (unsigned_short *)((long)&uStack_28 + 4);
      }
      *obj = uVar4;
      vector<unsigned_short>::push_back(codes,obj);
    }
    *size = 0;
  }
  return;
}

Assistant:

static inline void end_nonzero_run(uint& size, uint len, crnlib::vector<uint16>& codes)
    {
        if (!size)
        {
            return;
        }

        if (size < cSmallMinNonZeroRunSize)
        {
            while (size--)
            {
                codes.push_back(static_cast<uint16>(len));
            }
        }
        else if (size <= cSmallMaxNonZeroRunSize)
        {
            codes.push_back(static_cast<uint16>(cSmallRepeatCode | ((size - cSmallMinNonZeroRunSize) << 8)));
        }
        else
        {
            CRNLIB_ASSERT((size >= cLargeMinNonZeroRunSize) && (size <= cLargeMaxNonZeroRunSize));
            codes.push_back(static_cast<uint16>(cLargeRepeatCode | ((size - cLargeMinNonZeroRunSize) << 8)));
        }

        size = 0;
    }